

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

CRuntimeFunctionPtr __thiscall
Refal2::CGlobalFunctionData::RuntimeFunction(CGlobalFunctionData *this,CProgramPtr *program)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  COperationList *pCVar1;
  TRuntimeModuleId TVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  CPreparatoryFunction *this_01;
  element_type *this_02;
  element_type *peVar4;
  CEmbeddedFunction *__p;
  COrdinaryFunction *__p_00;
  TOperationAddress pCVar5;
  CRuntimeFunction *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  CRuntimeFunctionPtr CVar6;
  
  if (program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    this_00 = &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
    p_Var3 = (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
             ._M_pi;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_01 = (CPreparatoryFunction *)
                (program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this_01 == (CPreparatoryFunction *)0x0) {
        __assert_fail("IsPreparatoryFunction()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                      ,0x8e,
                      "CRuntimeFunctionPtr Refal2::CGlobalFunctionData::RuntimeFunction(const CProgramPtr &) const"
                     );
      }
      if (this_01->type == PFT_Empty) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (in_RDX._M_pi)->_vptr__Sp_counted_base[7];
        peVar4 = (element_type *)(in_RDX._M_pi)->_vptr__Sp_counted_base[8];
        if (peVar4 != (element_type *)0x0) {
          in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            pCVar1 = &(peVar4->super_CCompilationContext).operationsHolder;
            *(int *)&pCVar1->_vptr_CNodeList = *(int *)&pCVar1->_vptr_CNodeList + 1;
            UNLOCK();
          }
          else {
            pCVar1 = &(peVar4->super_CCompilationContext).operationsHolder;
            *(int *)&pCVar1->_vptr_CNodeList = *(int *)&pCVar1->_vptr_CNodeList + 1;
          }
        }
        program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var3;
        this_02 = program[2].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        program[2].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        if (this_02 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
          in_RDX._M_pi = extraout_RDX_01;
        }
      }
      else {
        __p_00 = (COrdinaryFunction *)operator_new(0x18);
        pCVar5 = CPreparatoryFunction::FirstOperation(this_01);
        if ((program->super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            (element_type *)0x0) {
          __assert_fail("IsPreparatoryFunction()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                        ,0x74,
                        "const TRuntimeModuleId Refal2::CGlobalFunctionData::RuntimeModuleId() const"
                       );
        }
        TVar2 = *(TRuntimeModuleId *)
                 &program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        (__p_00->super_CRuntimeFunction).type = RFT_Ordinary;
        __p_00->firstOperation = pCVar5;
        __p_00->runtimeModuleId = TVar2;
        if (pCVar5 == (TOperationAddress)0x0) {
          __assert_fail("firstOperation != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/Function.h"
                        ,0x4b,
                        "Refal2::COrdinaryFunction::COrdinaryFunction(const TOperationAddress, TRuntimeModuleId)"
                       );
        }
        std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
        reset<Refal2::COrdinaryFunction>
                  ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   __p_00);
        in_RDX._M_pi = extraout_RDX_00;
      }
    }
    else {
      __p = (CEmbeddedFunction *)operator_new(0x10);
      (__p->super_CRuntimeFunction).type = RFT_Embedded;
      __p->embeddedFunction = (TEmbeddedFunctionPtr)p_Var3;
      std::__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>::
      reset<Refal2::CEmbeddedFunction>
                ((__shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
      in_RDX._M_pi = extraout_RDX;
    }
  }
  this->preparatoryFunction =
       (CPreparatoryFunction *)
       program[1].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  peVar4 = program[2].super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->embeddedFunction = (TEmbeddedFunctionPtr)peVar4;
  if (peVar4 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar1 = &(peVar4->super_CCompilationContext).operationsHolder;
      *(int *)&pCVar1->_vptr_CNodeList = *(int *)&pCVar1->_vptr_CNodeList + 1;
      UNLOCK();
    }
    else {
      pCVar1 = &(peVar4->super_CCompilationContext).operationsHolder;
      *(int *)&pCVar1->_vptr_CNodeList = *(int *)&pCVar1->_vptr_CNodeList + 1;
    }
  }
  CVar6.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar6.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CRuntimeFunctionPtr)
         CVar6.super___shared_ptr<Refal2::CRuntimeFunction,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CRuntimeFunctionPtr CGlobalFunctionData::RuntimeFunction(
	const CProgramPtr& program ) const
{
	if( !static_cast<bool>( runtimeFunction ) ) {
		if( IsEmbeddedFunction() ) {
			runtimeFunction.reset( new CEmbeddedFunction(
				embeddedFunction ) );
		} else {
			assert( IsPreparatoryFunction() );
			if( PreparatoryFunction()->IsEmpty() ) {
				runtimeFunction = program->EmptyFunction();
			} else {
				runtimeFunction.reset( new COrdinaryFunction(
					PreparatoryFunction()->FirstOperation(),
					RuntimeModuleId() ) );
			}
		}
	}
	return runtimeFunction;
}